

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int IsPipeliningPossible(Curl_easy *handle,connectdata *conn)

{
  _Bool _Var1;
  uint local_1c;
  int avail;
  connectdata *conn_local;
  Curl_easy *handle_local;
  
  local_1c = 0;
  if (((conn->handler->protocol & 3) != 0) &&
     ((((conn->bits).protoconnstart & 1U) == 0 || (((conn->bits).close & 1U) == 0)))) {
    _Var1 = Curl_pipeline_wanted(handle->multi,1);
    if ((_Var1) &&
       (((handle->set).httpversion != 1 &&
        (((handle->set).httpreq == HTTPREQ_GET || ((handle->set).httpreq == HTTPREQ_HEAD)))))) {
      local_1c = 1;
    }
    _Var1 = Curl_pipeline_wanted(handle->multi,2);
    if ((_Var1) && (2 < (handle->set).httpversion)) {
      local_1c = local_1c | 2;
    }
  }
  return local_1c;
}

Assistant:

static int IsPipeliningPossible(const struct Curl_easy *handle,
                                const struct connectdata *conn)
{
  int avail = 0;

  /* If a HTTP protocol and pipelining is enabled */
  if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
     (!conn->bits.protoconnstart || !conn->bits.close)) {

    if(Curl_pipeline_wanted(handle->multi, CURLPIPE_HTTP1) &&
       (handle->set.httpversion != CURL_HTTP_VERSION_1_0) &&
       (handle->set.httpreq == HTTPREQ_GET ||
        handle->set.httpreq == HTTPREQ_HEAD))
      /* didn't ask for HTTP/1.0 and a GET or HEAD */
      avail |= CURLPIPE_HTTP1;

    if(Curl_pipeline_wanted(handle->multi, CURLPIPE_MULTIPLEX) &&
       (handle->set.httpversion >= CURL_HTTP_VERSION_2))
      /* allows HTTP/2 */
      avail |= CURLPIPE_MULTIPLEX;
  }
  return avail;
}